

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueTest.hpp
# Opt level: O2

void Qentem::Test::TestAddition5(QTest *test)

{
  SizeT SVar1;
  Value<char> *pVVar2;
  char *pcVar3;
  bool bVar4;
  bool bVar5;
  anon_union_16_5_5c8fea6c_for_Value<char>_1 local_d8;
  undefined1 local_c8;
  ValueC value1;
  String<char> local_a0;
  char *c_str;
  ValueC value2;
  char *c_str2;
  ValueC *arr_storage;
  VString str;
  VArray arr_var;
  
  str.storage_ = (char *)0x0;
  str.length_ = 0;
  value1.field_0.array_.storage_ = (Value<char> *)0x0;
  value1.field_0._8_8_ = 0;
  value1.type_ = Undefined;
  value2.type_ = Undefined;
  value2.field_0.array_.storage_ = (Value<char> *)0x0;
  value2.field_0._8_8_ = 0;
  arr_var.storage_ = (Value<char> *)0x0;
  arr_var.index_ = 0;
  arr_var.capacity_ = 0;
  Value<char>::reset(&value2);
  value2.type_ = True;
  QTest::IsTrue(test,true,0xf84);
  Value<char>::operator+=(&value1,&value2);
  bVar5 = true;
  bVar4 = true;
  if (value1.type_ != Array) {
    if (value1.type_ == ValuePtr) {
      bVar4 = (value1.field_0.array_.storage_)->type_ == Array;
    }
    else {
      bVar4 = false;
    }
  }
  QTest::IsTrue(test,bVar4,0xf88);
  local_d8._0_4_ = Value<char>::Size(&value1);
  local_a0.storage_._0_4_ = 1;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,(uint *)&local_d8,(uint *)&local_a0,0xf89);
  pVVar2 = Value<char>::operator[](&value1,0);
  bVar4 = Value<char>::IsTrue(pVVar2);
  QTest::IsTrue(test,bVar4,0xf8a);
  Value<char>::operator+=(&value2,true);
  Value<char>::operator+=(&value2,false);
  Value<char>::operator+=(&value2,(NullType)0x0);
  Value<char>::operator+=(&value2,"v");
  Value<char>::operator+=(&value2,4);
  Array<Qentem::Value<char>_>::Array(&local_d8.array_,1,false);
  Value<char>::operator+=(&value2,&local_d8.array_);
  Array<Qentem::Value<char>_>::~Array(&local_d8.array_);
  HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>::
  HashTable((HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
             *)&local_d8.array_,1);
  Value<char>::operator+=(&value2,&local_d8.object_);
  HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>::
  ~HashTable((HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
              *)&local_d8.array_);
  Value<char>::reset(&value2);
  value2.type_ = True;
  Value<char>::operator+=(&value1,&value2);
  if (value1.type_ != Array) {
    if (value1.type_ == ValuePtr) {
      bVar5 = (value1.field_0.array_.storage_)->type_ == Array;
    }
    else {
      bVar5 = false;
    }
  }
  QTest::IsTrue(test,bVar5,0xf96);
  local_d8._0_4_ = Value<char>::Size(&value1);
  local_a0.storage_._0_4_ = 2;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,(uint *)&local_d8,(uint *)&local_a0,0xf97);
  pVVar2 = Value<char>::operator[](&value1,0);
  bVar4 = Value<char>::IsTrue(pVVar2);
  QTest::IsTrue(test,bVar4,0xf98);
  pVVar2 = Value<char>::operator[](&value1,1);
  bVar4 = Value<char>::IsTrue(pVVar2);
  QTest::IsTrue(test,bVar4,0xf99);
  Value<char>::Reset(&value1);
  Value<char>::reset(&value2);
  value2.type_ = False;
  Value<char>::operator+=(&value1,&value2);
  bVar5 = true;
  bVar4 = true;
  if (value1.type_ != Array) {
    if (value1.type_ == ValuePtr) {
      bVar4 = (value1.field_0.array_.storage_)->type_ == Array;
    }
    else {
      bVar4 = false;
    }
  }
  QTest::IsTrue(test,bVar4,0xfa1);
  local_d8._0_4_ = Value<char>::Size(&value1);
  local_a0.storage_._0_4_ = 1;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,(uint *)&local_d8,(uint *)&local_a0,0xfa2);
  pVVar2 = Value<char>::operator[](&value1,0);
  bVar4 = Value<char>::IsFalse(pVVar2);
  QTest::IsTrue(test,bVar4,0xfa3);
  Value<char>::reset(&value2);
  value2.type_ = False;
  Value<char>::operator+=(&value1,&value2);
  if (value1.type_ != Array) {
    if (value1.type_ == ValuePtr) {
      bVar5 = (value1.field_0.array_.storage_)->type_ == Array;
    }
    else {
      bVar5 = false;
    }
  }
  QTest::IsTrue(test,bVar5,0xfa7);
  local_d8._0_4_ = Value<char>::Size(&value1);
  local_a0.storage_._0_4_ = 2;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,(uint *)&local_d8,(uint *)&local_a0,0xfa8);
  pVVar2 = Value<char>::operator[](&value1,0);
  bVar4 = Value<char>::IsFalse(pVVar2);
  QTest::IsTrue(test,bVar4,0xfa9);
  pVVar2 = Value<char>::operator[](&value1,1);
  bVar4 = Value<char>::IsFalse(pVVar2);
  QTest::IsTrue(test,bVar4,0xfaa);
  Value<char>::Reset(&value1);
  Value<char>::reset(&value2);
  value2.type_ = Null;
  Value<char>::operator+=(&value1,&value2);
  bVar5 = true;
  bVar4 = true;
  if (value1.type_ != Array) {
    if (value1.type_ == ValuePtr) {
      bVar4 = (value1.field_0.array_.storage_)->type_ == Array;
    }
    else {
      bVar4 = false;
    }
  }
  QTest::IsTrue(test,bVar4,0xfb1);
  local_d8._0_4_ = Value<char>::Size(&value1);
  local_a0.storage_._0_4_ = 1;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,(uint *)&local_d8,(uint *)&local_a0,0xfb2);
  pVVar2 = Value<char>::operator[](&value1,0);
  bVar4 = Value<char>::IsNull(pVVar2);
  QTest::IsTrue(test,bVar4,0xfb3);
  Value<char>::reset(&value2);
  value2.type_ = Null;
  Value<char>::operator+=(&value1,&value2);
  if (value1.type_ != Array) {
    if (value1.type_ == ValuePtr) {
      bVar5 = (value1.field_0.array_.storage_)->type_ == Array;
    }
    else {
      bVar5 = false;
    }
  }
  QTest::IsTrue(test,bVar5,0xfb7);
  local_d8._0_4_ = Value<char>::Size(&value1);
  local_a0.storage_._0_4_ = 2;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,(uint *)&local_d8,(uint *)&local_a0,0xfb8);
  pVVar2 = Value<char>::operator[](&value1,0);
  bVar4 = Value<char>::IsNull(pVVar2);
  QTest::IsTrue(test,bVar4,0xfb9);
  pVVar2 = Value<char>::operator[](&value1,1);
  bVar4 = Value<char>::IsNull(pVVar2);
  QTest::IsTrue(test,bVar4,0xfba);
  Value<char>::Reset(&value1);
  String<char>::String((String<char> *)&local_d8.array_,"-ABCDEF0123456789ABCDEF0123456789-");
  String<char>::operator=(&str,(String<char> *)&local_d8.array_);
  Memory::Deallocate((void *)local_d8.number_);
  c_str = str.storage_;
  Value<char>::operator=(&value2,&str);
  Value<char>::operator+=(&value1,&value2);
  bVar5 = true;
  bVar4 = true;
  if (value1.type_ != Array) {
    if (value1.type_ == ValuePtr) {
      bVar4 = (value1.field_0.array_.storage_)->type_ == Array;
    }
    else {
      bVar4 = false;
    }
  }
  QTest::IsTrue(test,bVar4,0xfc3);
  SVar1 = Value<char>::Size(&value1);
  local_d8._0_4_ = SVar1;
  local_a0.storage_._0_4_ = 1;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,(uint *)&local_d8,(uint *)&local_a0,0xfc4);
  pVVar2 = Value<char>::operator[](&value1,0);
  bVar4 = Value<char>::IsString(pVVar2);
  QTest::IsTrue(test,bVar4,0xfc5);
  pVVar2 = Value<char>::operator[](&value1,0);
  local_d8.string_.storage_ = Value<char>::StringStorage(pVVar2);
  QTest::IsEqual<char_const*,char_const*>(test,(char **)&local_d8.value_,&c_str,0xfc6);
  pVVar2 = Value<char>::operator[](&value1,0);
  pcVar3 = Value<char>::StringStorage(pVVar2);
  bVar4 = StringUtils::IsEqual<char>(pcVar3,"-ABCDEF0123456789ABCDEF0123456789-",0x22);
  QTest::IsTrue(test,bVar4,0xfc7);
  String<char>::String((String<char> *)&local_d8.array_,"#0123456789ABCDEF0123456789ABCDEF#");
  String<char>::operator=(&str,(String<char> *)&local_d8.array_);
  Memory::Deallocate((void *)local_d8.number_);
  c_str2 = str.storage_;
  Value<char>::operator=(&value2,&str);
  Value<char>::operator+=(&value1,&value2);
  if (value1.type_ != Array) {
    if (value1.type_ == ValuePtr) {
      bVar5 = (value1.field_0.array_.storage_)->type_ == Array;
    }
    else {
      bVar5 = false;
    }
  }
  QTest::IsTrue(test,bVar5,0xfce);
  SVar1 = Value<char>::Size(&value1);
  local_d8._0_4_ = SVar1;
  local_a0.storage_._0_4_ = 2;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,(uint *)&local_d8,(uint *)&local_a0,0xfcf);
  pVVar2 = Value<char>::operator[](&value1,0);
  bVar4 = Value<char>::IsString(pVVar2);
  QTest::IsTrue(test,bVar4,0xfd0);
  pVVar2 = Value<char>::operator[](&value1,1);
  bVar4 = Value<char>::IsString(pVVar2);
  QTest::IsTrue(test,bVar4,0xfd1);
  pVVar2 = Value<char>::operator[](&value1,0);
  local_d8.string_.storage_ = Value<char>::StringStorage(pVVar2);
  QTest::IsEqual<char_const*,char_const*>(test,(char **)&local_d8.value_,&c_str,0xfd2);
  pVVar2 = Value<char>::operator[](&value1,1);
  local_d8.string_.storage_ = Value<char>::StringStorage(pVVar2);
  QTest::IsEqual<char_const*,char_const*>(test,(char **)&local_d8.value_,&c_str2,0xfd3);
  pVVar2 = Value<char>::operator[](&value1,0);
  pcVar3 = Value<char>::StringStorage(pVVar2);
  bVar4 = StringUtils::IsEqual<char>(pcVar3,"-ABCDEF0123456789ABCDEF0123456789-",0x22);
  QTest::IsTrue(test,bVar4,0xfd4);
  pVVar2 = Value<char>::operator[](&value1,1);
  pcVar3 = Value<char>::StringStorage(pVVar2);
  bVar4 = StringUtils::IsEqual<char>(pcVar3,"#0123456789ABCDEF0123456789ABCDEF#",0x22);
  QTest::IsTrue(test,bVar4,0xfd5);
  Value<char>::Reset(&value1);
  Array<Qentem::Value<char>_>::Array(&local_d8.array_,1,false);
  Value<char>::operator=(&value2,&local_d8.array_);
  Array<Qentem::Value<char>_>::~Array(&local_d8.array_);
  Value<char>::Merge(&value1,&value2);
  bVar5 = true;
  bVar4 = true;
  if (value1.type_ != Array) {
    if (value1.type_ == ValuePtr) {
      bVar4 = (value1.field_0.array_.storage_)->type_ == Array;
    }
    else {
      bVar4 = false;
    }
  }
  QTest::IsTrue(test,bVar4,0xfdb);
  SVar1 = Value<char>::Size(&value1);
  local_a0.storage_._0_4_ = 0;
  local_d8._0_4_ = SVar1;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,(uint *)&local_d8,(uint *)&local_a0,0xfdc);
  pVVar2 = (Value<char> *)0x0;
  if (value1.type_ == Array) {
    pVVar2 = &value1;
  }
  QTest::IsNotNull(test,pVVar2,0xfdd);
  pVVar2 = (Value<char> *)0x0;
  if (value2.type_ == Array) {
    pVVar2 = &value2;
  }
  QTest::IsNotNull(test,pVVar2,0xfde);
  Array<Qentem::Value<char>_>::Array(&local_d8.array_,1,false);
  Value<char>::operator=(&value2,&local_d8.array_);
  Array<Qentem::Value<char>_>::~Array(&local_d8.array_);
  Value<char>::Merge(&value1,&value2);
  if (value1.type_ != Array) {
    if (value1.type_ == ValuePtr) {
      bVar5 = (value1.field_0.array_.storage_)->type_ == Array;
    }
    else {
      bVar5 = false;
    }
  }
  QTest::IsTrue(test,bVar5,0xfe2);
  local_d8._0_4_ = Value<char>::Size(&value1);
  local_a0.storage_ = (char *)((ulong)local_a0.storage_._4_4_ << 0x20);
  QTest::IsEqual<unsigned_int,unsigned_int>(test,(uint *)&local_d8,(uint *)&local_a0,0xfe3);
  pVVar2 = (Value<char> *)0x0;
  if (value1.type_ == Array) {
    pVVar2 = &value1;
  }
  QTest::IsNotNull(test,pVVar2,0xfe4);
  pVVar2 = (Value<char> *)0x0;
  if (value2.type_ == Array) {
    pVVar2 = &value2;
  }
  QTest::IsNull(test,pVVar2,0xfe5);
  Value<char>::Reset(&value1);
  local_d8.array_.storage_ = (Value<char> *)0x0;
  local_d8._8_8_ = 0;
  local_c8 = 9;
  Array<Qentem::Value<char>_>::operator+=(&arr_var,(Value<char> *)&local_d8.array_);
  Value<char>::~Value((Value<char> *)&local_d8.array_);
  local_d8.array_.storage_ = (Value<char> *)0x0;
  local_d8._8_8_ = 0;
  local_c8 = 8;
  Array<Qentem::Value<char>_>::operator+=(&arr_var,(Value<char> *)&local_d8.array_);
  Value<char>::~Value((Value<char> *)&local_d8.array_);
  String<char>::String(&local_a0,"-ABCDEF0123456789ABCDEF0123456789-");
  SVar1 = local_a0.length_;
  local_d8.array_.storage_ = (Value<char> *)local_a0.storage_;
  local_a0.length_ = 0;
  local_a0.storage_ = (char *)0x0;
  local_d8.array_.index_ = SVar1;
  local_c8 = 4;
  Array<Qentem::Value<char>_>::operator+=(&arr_var,(Value<char> *)&local_d8.array_);
  Value<char>::~Value((Value<char> *)&local_d8.array_);
  Memory::Deallocate(local_a0.storage_);
  arr_storage = arr_var.storage_;
  c_str = Value<char>::StringStorage(arr_var.storage_ + 2);
  Value<char>::operator=(&value2,&arr_var);
  Value<char>::Merge(&value1,&value2);
  bVar4 = true;
  if (value1.type_ != Array) {
    if (value1.type_ == ValuePtr) {
      bVar4 = (value1.field_0.array_.storage_)->type_ == Array;
    }
    else {
      bVar4 = false;
    }
  }
  QTest::IsTrue(test,bVar4,0xff2);
  SVar1 = Value<char>::Size(&value1);
  local_d8._0_4_ = SVar1;
  local_a0.storage_ = (char *)CONCAT44(local_a0.storage_._4_4_,3);
  QTest::IsEqual<unsigned_int,unsigned_int>(test,(uint *)&local_d8,(uint *)&local_a0,0xff3);
  pVVar2 = (Value<char> *)0x0;
  if (value1.type_ == Array) {
    pVVar2 = &value1;
  }
  QTest::IsNotNull(test,pVVar2,0xff4);
  QTest::IsNotNull(test,(void *)value1.field_0.number_,0xff5);
  local_d8.value_ = value1.field_0.value_;
  QTest::IsNotEqual<Qentem::Value<char>const*,Qentem::Value<char>const*>
            (test,&local_d8.value_,&arr_storage,0xff6);
  pVVar2 = Value<char>::operator[](&value1,0);
  bVar4 = Value<char>::IsFalse(pVVar2);
  QTest::IsTrue(test,bVar4,0xff7);
  pVVar2 = Value<char>::operator[](&value1,1);
  bVar4 = Value<char>::IsTrue(pVVar2);
  QTest::IsTrue(test,bVar4,0xff8);
  pVVar2 = Value<char>::operator[](&value1,2);
  bVar4 = Value<char>::IsString(pVVar2);
  QTest::IsTrue(test,bVar4,0xff9);
  pVVar2 = Value<char>::operator[](&value1,2);
  local_d8.string_.storage_ = Value<char>::StringStorage(pVVar2);
  QTest::IsEqual<char_const*,char_const*>(test,(char **)&local_d8.value_,&c_str,0xffa);
  pVVar2 = Value<char>::operator[](&value1,2);
  pcVar3 = Value<char>::StringStorage(pVVar2);
  bVar4 = StringUtils::IsEqual<char>(pcVar3,"-ABCDEF0123456789ABCDEF0123456789-",0x22);
  QTest::IsTrue(test,bVar4,0xffb);
  Array<Qentem::Value<char>_>::Reset(&arr_var);
  local_d8.array_.storage_ = (Value<char> *)0x0;
  local_d8._8_8_ = 0;
  local_c8 = 10;
  Array<Qentem::Value<char>_>::operator+=(&arr_var,(Value<char> *)&local_d8.array_);
  Value<char>::~Value((Value<char> *)&local_d8.array_);
  local_d8.number_ = (QNumber64)0xe;
  local_c8 = 6;
  Array<Qentem::Value<char>_>::operator+=(&arr_var,(Value<char> *)&local_d8.array_);
  Value<char>::~Value((Value<char> *)&local_d8.array_);
  String<char>::String(&local_a0,"#0123456789ABCDEF0123456789ABCDEF#");
  SVar1 = local_a0.length_;
  local_d8.array_.storage_ = (Value<char> *)local_a0.storage_;
  local_a0.length_ = 0;
  local_a0.storage_ = (char *)0x0;
  local_d8.array_.index_ = SVar1;
  local_c8 = 4;
  Array<Qentem::Value<char>_>::operator+=(&arr_var,(Value<char> *)&local_d8.array_);
  Value<char>::~Value((Value<char> *)&local_d8.array_);
  Memory::Deallocate(local_a0.storage_);
  arr_storage = arr_var.storage_;
  c_str2 = Value<char>::StringStorage(arr_var.storage_ + 2);
  Value<char>::operator=(&value2,&arr_var);
  Value<char>::Merge(&value1,&value2);
  bVar4 = true;
  if (value2.type_ != Undefined) {
    if (value2.type_ == ValuePtr) {
      bVar4 = (value2.field_0.array_.storage_)->type_ == Undefined;
    }
    else {
      bVar4 = false;
    }
  }
  QTest::IsTrue(test,bVar4,0x1006);
  if (value1.type_ == Array) {
    bVar4 = true;
  }
  else if (value1.type_ == ValuePtr) {
    bVar4 = (value1.field_0.array_.storage_)->type_ == Array;
  }
  else {
    bVar4 = false;
  }
  QTest::IsTrue(test,bVar4,0x1007);
  SVar1 = Value<char>::Size(&value1);
  local_d8._0_4_ = SVar1;
  local_a0.storage_ = (char *)CONCAT44(local_a0.storage_._4_4_,6);
  QTest::IsEqual<unsigned_int,unsigned_int>(test,(uint *)&local_d8,(uint *)&local_a0,0x1008);
  pVVar2 = (Value<char> *)0x0;
  if (value1.type_ == Array) {
    pVVar2 = &value1;
  }
  QTest::IsNotNull(test,pVVar2,0x1009);
  QTest::IsNotNull(test,(void *)value1.field_0.number_,0x100a);
  local_d8.value_ = value1.field_0.value_;
  QTest::IsNotEqual<Qentem::Value<char>const*,Qentem::Value<char>const*>
            (test,&local_d8.value_,&arr_storage,0x100b);
  pVVar2 = Value<char>::operator[](&value1,0);
  bVar4 = Value<char>::IsFalse(pVVar2);
  QTest::IsTrue(test,bVar4,0x100c);
  pVVar2 = Value<char>::operator[](&value1,1);
  bVar4 = Value<char>::IsTrue(pVVar2);
  QTest::IsTrue(test,bVar4,0x100d);
  pVVar2 = Value<char>::operator[](&value1,2);
  bVar4 = Value<char>::IsString(pVVar2);
  QTest::IsTrue(test,bVar4,0x100e);
  pVVar2 = Value<char>::operator[](&value1,2);
  local_d8.string_.storage_ = Value<char>::StringStorage(pVVar2);
  QTest::IsEqual<char_const*,char_const*>(test,(char **)&local_d8.value_,&c_str,0x100f);
  pVVar2 = Value<char>::operator[](&value1,2);
  pcVar3 = Value<char>::StringStorage(pVVar2);
  bVar4 = StringUtils::IsEqual<char>(pcVar3,"-ABCDEF0123456789ABCDEF0123456789-",0x22);
  QTest::IsTrue(test,bVar4,0x1010);
  pVVar2 = Value<char>::operator[](&value1,3);
  bVar4 = Value<char>::IsNull(pVVar2);
  QTest::IsTrue(test,bVar4,0x1011);
  pVVar2 = Value<char>::operator[](&value1,4);
  bVar4 = Value<char>::IsNumber(pVVar2);
  QTest::IsTrue(test,bVar4,0x1012);
  pVVar2 = Value<char>::operator[](&value1,4);
  local_d8.number_ = (QNumber64)Value<char>::GetDouble(pVVar2);
  local_a0.storage_ = (char *)0x402c000000000000;
  QTest::IsEqual<double,double>(test,(double *)&local_d8.number_,(double *)&local_a0,0x1013);
  pVVar2 = Value<char>::operator[](&value1,5);
  bVar4 = Value<char>::IsString(pVVar2);
  QTest::IsTrue(test,bVar4,0x1014);
  pVVar2 = Value<char>::operator[](&value1,5);
  local_d8.string_.storage_ = Value<char>::StringStorage(pVVar2);
  QTest::IsEqual<char_const*,char_const*>(test,(char **)&local_d8.value_,&c_str2,0x1015);
  pVVar2 = Value<char>::operator[](&value1,5);
  pcVar3 = Value<char>::StringStorage(pVVar2);
  bVar4 = StringUtils::IsEqual<char>(pcVar3,"#0123456789ABCDEF0123456789ABCDEF#",0x22);
  QTest::IsTrue(test,bVar4,0x1016);
  Value<char>::Reset(&value1);
  Memory::Deallocate(str.storage_);
  Array<Qentem::Value<char>_>::~Array(&arr_var);
  Value<char>::~Value(&value2);
  Value<char>::~Value(&value1);
  return;
}

Assistant:

static void TestAddition5(QTest &test) {
    ValueC        value1;
    ValueC        value2;
    VArray        arr_var;
    const ValueC *arr_storage;
    VString       str;

    /////////////////

    value2 = true;
    test.IsTrue(value2.IsTrue(), __LINE__);

    value1 += Memory::Move(value2);

    test.IsTrue(value1.IsArray(), __LINE__);
    test.IsEqual(value1.Size(), 1U, __LINE__);
    test.IsTrue(value1[0].IsTrue(), __LINE__);

    value2 += true;
    value2 += false;
    value2 += nullptr;
    value2 += "v";
    value2 += 4;
    value2 += VArray(1);
    value2 += VHArray(1);

    value2 = true;
    value1 += Memory::Move(value2);
    test.IsTrue(value1.IsArray(), __LINE__);
    test.IsEqual(value1.Size(), 2U, __LINE__);
    test.IsTrue(value1[0].IsTrue(), __LINE__);
    test.IsTrue(value1[1].IsTrue(), __LINE__);

    value1.Reset();
    /////////////////

    value2 = false;

    value1 += Memory::Move(value2);
    test.IsTrue(value1.IsArray(), __LINE__);
    test.IsEqual(value1.Size(), 1U, __LINE__);
    test.IsTrue(value1[0].IsFalse(), __LINE__);

    value2 = false;
    value1 += Memory::Move(value2);
    test.IsTrue(value1.IsArray(), __LINE__);
    test.IsEqual(value1.Size(), 2U, __LINE__);
    test.IsTrue(value1[0].IsFalse(), __LINE__);
    test.IsTrue(value1[1].IsFalse(), __LINE__);

    value1.Reset();
    /////////////////

    value2 = nullptr;
    value1 += Memory::Move(value2);
    test.IsTrue(value1.IsArray(), __LINE__);
    test.IsEqual(value1.Size(), 1U, __LINE__);
    test.IsTrue(value1[0].IsNull(), __LINE__);

    value2 = nullptr;
    value1 += Memory::Move(value2);
    test.IsTrue(value1.IsArray(), __LINE__);
    test.IsEqual(value1.Size(), 2U, __LINE__);
    test.IsTrue(value1[0].IsNull(), __LINE__);
    test.IsTrue(value1[1].IsNull(), __LINE__);

    value1.Reset();
    /////////////////
    str               = VString("-ABCDEF0123456789ABCDEF0123456789-");
    const char *c_str = str.First();
    value2            = Memory::Move(str);

    value1 += Memory::Move(value2);
    test.IsTrue(value1.IsArray(), __LINE__);
    test.IsEqual(value1.Size(), 1U, __LINE__);
    test.IsTrue(value1[0].IsString(), __LINE__);
    test.IsEqual(value1[0].StringStorage(), c_str, __LINE__);
    test.IsTrue(StringUtils::IsEqual(value1[0].StringStorage(), "-ABCDEF0123456789ABCDEF0123456789-", 34), __LINE__);

    str                = VString("#0123456789ABCDEF0123456789ABCDEF#");
    const char *c_str2 = str.First();
    value2             = Memory::Move(str);

    value1 += Memory::Move(value2);
    test.IsTrue(value1.IsArray(), __LINE__);
    test.IsEqual(value1.Size(), 2U, __LINE__);
    test.IsTrue(value1[0].IsString(), __LINE__);
    test.IsTrue(value1[1].IsString(), __LINE__);
    test.IsEqual(value1[0].StringStorage(), c_str, __LINE__);
    test.IsEqual(value1[1].StringStorage(), c_str2, __LINE__);
    test.IsTrue(StringUtils::IsEqual(value1[0].StringStorage(), "-ABCDEF0123456789ABCDEF0123456789-", 34), __LINE__);
    test.IsTrue(StringUtils::IsEqual(value1[1].StringStorage(), "#0123456789ABCDEF0123456789ABCDEF#", 34), __LINE__);
    value1.Reset();
    /////////////////

    value2 = VArray(1);
    value1.Merge(value2);
    test.IsTrue(value1.IsArray(), __LINE__);
    test.IsEqual(value1.Size(), 0U, __LINE__);
    test.IsNotNull(value1.GetArray(), __LINE__);
    test.IsNotNull(value2.GetArray(), __LINE__);

    value2 = VArray(1);
    value1.Merge(Memory::Move(value2));
    test.IsTrue(value1.IsArray(), __LINE__);
    test.IsEqual(value1.Size(), 0U, __LINE__);
    test.IsNotNull(value1.GetArray(), __LINE__);
    test.IsNull(value2.GetArray(), __LINE__);

    value1.Reset();
    ///

    arr_var += ValueC{ValueType::False};
    arr_var += ValueC{ValueType::True};
    arr_var += ValueC{VString("-ABCDEF0123456789ABCDEF0123456789-")};
    arr_storage = arr_var.First();
    c_str       = arr_storage[2].StringStorage();
    value2      = Memory::Move(arr_var);

    value1.Merge(Memory::Move(value2));
    test.IsTrue(value1.IsArray(), __LINE__);
    test.IsEqual(value1.Size(), 3U, __LINE__);
    test.IsNotNull(value1.GetArray(), __LINE__);
    test.IsNotNull(value1.GetArray()->First(), __LINE__);
    test.IsNotEqual(value1.GetArray()->First(), arr_storage, __LINE__);
    test.IsTrue(value1[0].IsFalse(), __LINE__);
    test.IsTrue(value1[1].IsTrue(), __LINE__);
    test.IsTrue(value1[2].IsString(), __LINE__);
    test.IsEqual(value1[2].StringStorage(), c_str, __LINE__);
    test.IsTrue(StringUtils::IsEqual(value1[2].StringStorage(), "-ABCDEF0123456789ABCDEF0123456789-", 34), __LINE__);

    arr_var.Reset();
    arr_var += ValueC{ValueType::Null};
    arr_var += ValueC{14};
    arr_var += ValueC{VString("#0123456789ABCDEF0123456789ABCDEF#")};
    arr_storage = arr_var.First();
    c_str2      = arr_storage[2].StringStorage();
    value2      = Memory::Move(arr_var);

    value1.Merge(Memory::Move(value2));
    test.IsTrue(value2.IsUndefined(), __LINE__);
    test.IsTrue(value1.IsArray(), __LINE__);
    test.IsEqual(value1.Size(), 6U, __LINE__);
    test.IsNotNull(value1.GetArray(), __LINE__);
    test.IsNotNull(value1.GetArray()->First(), __LINE__);
    test.IsNotEqual(value1.GetArray()->First(), arr_storage, __LINE__);
    test.IsTrue(value1[0].IsFalse(), __LINE__);
    test.IsTrue(value1[1].IsTrue(), __LINE__);
    test.IsTrue(value1[2].IsString(), __LINE__);
    test.IsEqual(value1[2].StringStorage(), c_str, __LINE__);
    test.IsTrue(StringUtils::IsEqual(value1[2].StringStorage(), "-ABCDEF0123456789ABCDEF0123456789-", 34), __LINE__);
    test.IsTrue(value1[3].IsNull(), __LINE__);
    test.IsTrue(value1[4].IsNumber(), __LINE__);
    test.IsEqual(value1[4].GetNumber(), 14.0, __LINE__);
    test.IsTrue(value1[5].IsString(), __LINE__);
    test.IsEqual(value1[5].StringStorage(), c_str2, __LINE__);
    test.IsTrue(StringUtils::IsEqual(value1[5].StringStorage(), "#0123456789ABCDEF0123456789ABCDEF#", 34), __LINE__);
    value1.Reset();
    //////////////////////////////////////////
}